

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngvalid.c
# Opt level: O1

void transform_test(png_modifier *pmIn,png_uint_32 idIn,image_transform *transform_listIn,char *name
                   )

{
  double dVar1;
  byte bVar2;
  color_encoding *pcVar3;
  jmp_buf *pa_Var4;
  png_modifier *ppVar5;
  int iVar6;
  size_t sVar7;
  size_t sVar8;
  png_structp pp;
  color_encoding *e;
  char cVar9;
  ulong uVar10;
  undefined4 in_register_00000034;
  ulong uVar11;
  long lVar12;
  int in_R8D;
  png_modification *pmm;
  bool bVar13;
  png_infop pi;
  char full_name [256];
  transform_display d;
  jmp_buf exception__env;
  png_infop local_728;
  double local_720;
  double local_718;
  double local_710;
  char local_708 [264];
  transform_display local_600;
  __jmp_buf_tag local_f8;
  
  memset(&local_600,0,0x508);
  e = (color_encoding *)(ulong)(uint)pm.use_update_info;
  standard_display_init
            (&local_600.this,(png_store *)((ulong)pmIn & 0xffffffff),0,pm.use_update_info,in_R8D);
  pa_Var4 = pm.this.exception_context.penv;
  local_600.pm = &pm;
  local_600.max_gamma_8 = 0x10;
  local_600.output_colour_type = 0xff;
  local_600.output_bit_depth = 0xff;
  local_600.unpacked = '\0';
  pm.this.exception_context.penv = (jmp_buf *)&local_f8;
  local_600.transform_list = (image_transform *)CONCAT44(in_register_00000034,idIn);
  iVar6 = _setjmp((__jmp_buf_tag *)pm.this.exception_context.penv);
  ppVar5 = local_600.pm;
  if (iVar6 != 0) {
    pm.this.exception_context.caught = 1;
    pm.this.exception_context.penv = pa_Var4;
    modifier_reset((png_modifier *)pm.this.exception_context.v.etmp);
    return;
  }
  modifier_set_encoding(local_600.pm);
  dVar1 = ppVar5->current_gamma;
  if ((dVar1 == 0.0) && (!NAN(dVar1))) goto LAB_0010fa12;
  pcVar3 = ppVar5->current_encoding;
  if ((pcVar3 == (color_encoding *)0x0) || (pcVar3 != ppVar5->encodings)) {
LAB_0010f755:
    local_600.gama_mod.this.modify_fn = (_func_int_png_modifier_ptr_png_modification_ptr_int *)0x0;
    local_600.gama_mod.this.add = 0;
    local_600.gama_mod.this._28_4_ = 0;
    local_600.gama_mod.this.next = (png_modification *)0x0;
    local_600.gama_mod.this.chunk = 0;
    local_600.gama_mod.this._12_4_ = 0;
    local_720 = dVar1;
    modification_reset(&local_600.gama_mod.this);
    local_600.gama_mod.this.chunk = 0x67414d41;
    local_600.gama_mod.this.modify_fn = gama_modify;
    local_600.gama_mod.this.add = 0x504c5445;
    dVar1 = floor(local_720 * 100000.0 + 0.5);
    local_600.gama_mod.gamma = (png_fixed_point)dVar1;
    local_600.gama_mod.this.next = ppVar5->modifications;
    ppVar5->modifications = &local_600.gama_mod.this;
    pcVar3 = ppVar5->current_encoding;
    if (pcVar3 == (color_encoding *)0x0) goto LAB_0010fa12;
    dVar1 = (pcVar3->red).X + (pcVar3->green).X + (pcVar3->blue).X;
    pmm = &local_600.chrm_mod.this;
    local_710 = (pcVar3->red).Y + (pcVar3->green).Y + (pcVar3->blue).Y;
    local_718 = dVar1 + local_710 + (pcVar3->red).Z + (pcVar3->green).Z + (pcVar3->blue).Z;
    local_600.chrm_mod.encoding = pcVar3;
    dVar1 = floor((dVar1 / local_718) * 100000.0 + 0.5);
    local_600.chrm_mod.wx = (png_fixed_point)dVar1;
    dVar1 = floor((local_710 / local_718) * 100000.0 + 0.5);
    local_600.chrm_mod.wy = (png_fixed_point)dVar1;
    dVar1 = (pcVar3->red).X;
    dVar1 = floor((dVar1 / ((pcVar3->red).Y + dVar1 + (pcVar3->red).Z)) * 100000.0 + 0.5);
    local_600.chrm_mod.rx = (png_fixed_point)dVar1;
    dVar1 = (pcVar3->red).Y;
    dVar1 = floor((dVar1 / ((pcVar3->red).X + dVar1 + (pcVar3->red).Z)) * 100000.0 + 0.5);
    local_600.chrm_mod.ry = (png_fixed_point)dVar1;
    dVar1 = (pcVar3->green).X;
    dVar1 = floor((dVar1 / ((pcVar3->green).Y + dVar1 + (pcVar3->green).Z)) * 100000.0 + 0.5);
    local_600.chrm_mod.gx = (png_fixed_point)dVar1;
    dVar1 = (pcVar3->green).Y;
    dVar1 = floor((dVar1 / ((pcVar3->green).X + dVar1 + (pcVar3->green).Z)) * 100000.0 + 0.5);
    local_600.chrm_mod.gy = (png_fixed_point)dVar1;
    dVar1 = (pcVar3->blue).X;
    dVar1 = floor((dVar1 / ((pcVar3->blue).Y + dVar1 + (pcVar3->blue).Z)) * 100000.0 + 0.5);
    local_600.chrm_mod.bx = (png_fixed_point)dVar1;
    dVar1 = (pcVar3->blue).Y;
    dVar1 = floor((dVar1 / ((pcVar3->blue).X + dVar1 + (pcVar3->blue).Z)) * 100000.0 + 0.5);
    local_600.chrm_mod.by = (png_fixed_point)dVar1;
    local_600.chrm_mod.this.next = (png_modification *)0x0;
    local_600.chrm_mod.this.chunk = 0;
    local_600.chrm_mod.this._12_4_ = 0;
    local_600.chrm_mod.this.modify_fn = (_func_int_png_modifier_ptr_png_modification_ptr_int *)0x0;
    local_600.chrm_mod.this.add = 0;
    local_600.chrm_mod.this._28_4_ = 0;
    modification_reset(pmm);
    local_600.chrm_mod.this.chunk = 0x6348524d;
    local_600.chrm_mod.this.modify_fn = chrm_modify;
    local_600.chrm_mod.this.add = 0x504c5445;
  }
  else {
    if ((pcVar3->gamma != dVar1) || (NAN(pcVar3->gamma) || NAN(dVar1))) goto LAB_0010f755;
    pmm = &local_600.srgb_mod.this;
    local_600.srgb_mod.this.modify_fn = (_func_int_png_modifier_ptr_png_modification_ptr_int *)0x0;
    local_600.srgb_mod.this.add = 0;
    local_600.srgb_mod.this._28_4_ = 0;
    local_600.srgb_mod.this.next = (png_modification *)0x0;
    local_600.srgb_mod.this.chunk = 0;
    local_600.srgb_mod.this._12_4_ = 0;
    modification_reset(pmm);
    local_600.srgb_mod.this.chunk = 0x73424954;
    local_600.srgb_mod.this.modify_fn = srgb_modify;
    local_600.srgb_mod.this.add = 0x504c5445;
    local_600.srgb_mod.intent = '\x03';
  }
  ((png_modification *)&pmm->next)->next = ppVar5->modifications;
  ppVar5->modifications = pmm;
LAB_0010fa12:
  (*(local_600.transform_list)->ini)(local_600.transform_list,&local_600);
  ppVar5 = local_600.pm;
  if ((transform_listIn == (image_transform *)0x0) ||
     (e = (color_encoding *)CONCAT71((int7)((ulong)e >> 8),*(char *)&transform_listIn->name),
     *(char *)&transform_listIn->name == '\0')) {
    uVar11 = 0;
  }
  else {
    uVar11 = 0;
    do {
      uVar10 = uVar11;
      local_708[uVar10] = (char)e;
      if (uVar10 == 0xff) {
        uVar11 = 0x100;
        break;
      }
      bVar2 = *(byte *)((long)&transform_listIn->name + uVar10 + 1);
      e = (color_encoding *)(ulong)bVar2;
      uVar11 = uVar10 + 1;
    } while (bVar2 != 0);
    e = (color_encoding *)0xff;
    if (0xfe < uVar10) {
      uVar11 = 0xff;
    }
  }
  local_708[uVar11] = '\0';
  sVar7 = safecat_color_encoding
                    (local_708,uVar11,(size_t)(local_600.pm)->current_encoding,e,
                     (local_600.pm)->current_gamma);
  if (ppVar5->encoding_ignored != 0) {
    bVar13 = sVar7 < 0x100;
    if (bVar13) {
      cVar9 = '[';
      lVar12 = -0xc;
      do {
        uVar11 = sVar7;
        local_708[uVar11] = cVar9;
        if (uVar11 == 0xff) {
          sVar7 = 0x100;
          break;
        }
        cVar9 = "progressive read implementation error"[lVar12];
        sVar7 = uVar11 + 1;
        lVar12 = lVar12 + 1;
      } while (lVar12 != 0);
      bVar13 = uVar11 < 0xff;
    }
    sVar8 = 0xff;
    if (bVar13) {
      sVar8 = sVar7;
    }
    local_708[sVar8] = '\0';
  }
  (local_600.pm)->state = modifier_start;
  (local_600.pm)->bit_depth = '\0';
  (local_600.pm)->colour_type = 0xff;
  (local_600.pm)->pending_len = 0;
  (local_600.pm)->pending_chunk = 0;
  (local_600.pm)->flush = 0;
  (local_600.pm)->buffer_count = 0;
  (local_600.pm)->buffer_position = 0;
  pp = set_store_for_read(&(local_600.pm)->this,&local_728,local_600.this.id,local_708);
  standard_palette_init(&local_600.this);
  if ((((local_600.pm)->this).field_0x18 & 0x40) == 0) {
    png_set_read_fn(pp,local_600.pm,modifier_read);
    png_read_info(pp,local_728);
    transform_info_imp(&local_600,pp,local_728);
    sequential_row(&local_600.this,pp,local_728,-1,0);
    if (local_600.this.speed == 0) {
      transform_image_validate(&local_600,pp,local_728);
    }
    else {
      (local_600.this.ps)->field_0x18 = (local_600.this.ps)->field_0x18 | 0x80;
    }
  }
  else {
    png_set_progressive_read_fn(pp,&local_600,transform_info,progressive_row,transform_end);
    modifier_progressive_read(local_600.pm,pp,local_728);
  }
  modifier_reset(local_600.pm);
  pm.this.exception_context.caught = 0;
  pm.this.exception_context.penv = pa_Var4;
  return;
}

Assistant:

static void
transform_test(png_modifier *pmIn, png_uint_32 idIn,
    const image_transform* transform_listIn, const char * const name)
{
   transform_display d;
   context(&pmIn->this, fault);

   transform_display_init(&d, pmIn, idIn, transform_listIn);

   Try
   {
      size_t pos = 0;
      png_structp pp;
      png_infop pi;
      char full_name[256];

      /* Make sure the encoding fields are correct and enter the required
       * modifications.
       */
      transform_set_encoding(&d);

      /* Add any modifications required by the transform list. */
      d.transform_list->ini(d.transform_list, &d);

      /* Add the color space information, if any, to the name. */
      pos = safecat(full_name, sizeof full_name, pos, name);
      pos = safecat_current_encoding(full_name, sizeof full_name, pos, d.pm);

      /* Get a png_struct for reading the image. */
      pp = set_modifier_for_read(d.pm, &pi, d.this.id, full_name);
      standard_palette_init(&d.this);

#     if 0
         /* Logging (debugging only) */
         {
            char buffer[256];

            (void)store_message(&d.pm->this, pp, buffer, sizeof buffer, 0,
               "running test");

            fprintf(stderr, "%s\n", buffer);
         }
#     endif

      /* Introduce the correct read function. */
      if (d.pm->this.progressive)
      {
         /* Share the row function with the standard implementation. */
         png_set_progressive_read_fn(pp, &d, transform_info, progressive_row,
            transform_end);

         /* Now feed data into the reader until we reach the end: */
         modifier_progressive_read(d.pm, pp, pi);
      }
      else
      {
         /* modifier_read expects a png_modifier* */
         png_set_read_fn(pp, d.pm, modifier_read);

         /* Check the header values: */
         png_read_info(pp, pi);

         /* Process the 'info' requirements. Only one image is generated */
         transform_info_imp(&d, pp, pi);

         sequential_row(&d.this, pp, pi, -1, 0);

         if (!d.this.speed)
            transform_image_validate(&d, pp, pi);
         else
            d.this.ps->validated = 1;
      }

      modifier_reset(d.pm);
   }

   Catch(fault)
   {
      modifier_reset(voidcast(png_modifier*,(void*)fault));
   }
}